

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O3

int SUNLinSolSetScalingVectors(SUNLinearSolver S,N_Vector s1,N_Vector s2)

{
  _func_int_SUNLinearSolver_N_Vector_N_Vector *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = S->ops->setscalingvectors;
  if (UNRECOVERED_JUMPTABLE != (_func_int_SUNLinearSolver_N_Vector_N_Vector *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(S,s1,s2);
    return iVar1;
  }
  return 0;
}

Assistant:

int SUNLinSolSetScalingVectors(SUNLinearSolver S,
                               N_Vector s1, N_Vector s2)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->setscalingvectors)
    ier = S->ops->setscalingvectors(S, s1, s2);
  else
    ier = SUNLS_SUCCESS;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return(ier);
}